

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::unpack_expression_type
          (string *__return_storage_ptr__,CompilerMSL *this,string *expr_str,SPIRType *type,
          uint32_t physical_type_id,bool packed,bool row_major)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  ulong in_RAX;
  SPIRType *pSVar7;
  long *plVar8;
  long lVar9;
  size_type *psVar10;
  undefined7 in_register_00000089;
  char (*pacVar11) [2];
  char (*pacVar12) [2];
  SPIRType *type_00;
  bool bVar13;
  char **ts_5;
  char (*in_stack_ffffffffffffff48) [2];
  uint32_t columns;
  undefined4 local_a8;
  uint local_a4;
  allocator local_9d;
  undefined4 local_9c;
  uint32_t physical_vecsize;
  uint32_t vecsize;
  string local_90;
  char *load_swiz;
  SPIRType *local_68;
  char *data_swiz;
  char *base_type;
  undefined1 *local_50;
  string *local_48;
  undefined1 local_40 [16];
  
  pacVar11 = (char (*) [2])CONCAT71(in_register_00000089,packed);
  pSVar7 = (SPIRType *)(in_RAX & 0xffffffffffffff00);
  if (physical_type_id == 0 && !packed) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (expr_str->_M_dataplus)._M_p;
    paVar1 = &expr_str->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar1) {
      uVar3 = *(undefined8 *)((long)&expr_str->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = expr_str->_M_string_length;
    (expr_str->_M_dataplus)._M_p = (pointer)paVar1;
    expr_str->_M_string_length = 0;
    (expr_str->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  pacVar12 = pacVar11;
  if (physical_type_id == 0) {
    type_00 = (SPIRType *)0x0;
  }
  else {
    pSVar7 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + physical_type_id);
    type_00 = pSVar7;
  }
  if (type_00 == (SPIRType *)0x0) {
    local_a8 = 0;
  }
  else {
    local_a8 = (undefined4)CONCAT71((int7)((ulong)pSVar7 >> 8),4 < type_00->vecsize);
  }
  local_9c = SUB84(pacVar11,0);
  local_68 = type;
  if ((type_00 == (SPIRType *)0x0) ||
     (bVar5 = Compiler::is_vector((Compiler *)this,type_00), !bVar5)) {
LAB_0020b172:
    bVar5 = false;
    bVar13 = false;
  }
  else {
    bVar5 = Compiler::is_array((Compiler *)this,type_00);
    if ((((~bVar5 | (byte)local_a8) & 1) != 0) || (type_00->vecsize <= type->vecsize))
    goto LAB_0020b172;
    ::std::__cxx11::string::string
              ((string *)&local_50,unpack_expression_type::swizzle_lut[type->vecsize - 1],&local_9d)
    ;
    bVar5 = true;
    if ((string *)expr_str->_M_string_length < local_48) {
      bVar13 = true;
    }
    else {
      iVar6 = ::std::__cxx11::string::compare
                        ((ulong)expr_str,(long)expr_str->_M_string_length - (long)local_48,local_48)
      ;
      bVar13 = iVar6 != 0;
    }
  }
  pSVar7 = local_68;
  if ((bVar5) && (local_50 != local_40)) {
    operator_delete(local_50);
  }
  if (bVar13) {
    if (2 < pSVar7->vecsize - 1) {
      __assert_fail("type.vecsize >= 1 && type.vecsize <= 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x15ce,
                    "virtual string spirv_cross::CompilerMSL::unpack_expression_type(string, const SPIRType &, uint32_t, bool, bool)"
                   );
    }
    CompilerGLSL::enclose_expression(&local_90,&this->super_CompilerGLSL,expr_str);
    plVar8 = (long *)::std::__cxx11::string::append((char *)&local_90);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar10 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar10) {
      lVar9 = plVar8[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar9;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    }
    __return_storage_ptr__->_M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    if ((type_00 != (SPIRType *)0x0) &&
       (bVar5 = Compiler::is_matrix((Compiler *)this,type_00), bVar5)) {
      bVar5 = Compiler::is_vector((Compiler *)this,pSVar7);
      if ((((~bVar5 | (byte)local_a8) & 1) == 0) && (pSVar7->vecsize < type_00->vecsize)) {
        if (3 < pSVar7->vecsize - 1) {
          __assert_fail("type.vecsize >= 1 && type.vecsize <= 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x15d6,
                        "virtual string spirv_cross::CompilerMSL::unpack_expression_type(string, const SPIRType &, uint32_t, bool, bool)"
                       );
        }
        CompilerGLSL::enclose_expression(&local_90,&this->super_CompilerGLSL,expr_str);
        ::std::operator+(__return_storage_ptr__,&local_90,
                         unpack_expression_type::swizzle_lut[pSVar7->vecsize - 1]);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p == &local_90.field_2) {
          return __return_storage_ptr__;
        }
        goto LAB_0020b341;
      }
    }
    bVar5 = Compiler::is_matrix((Compiler *)this,pSVar7);
    uVar4 = local_9c;
    if (bVar5) {
      if (type_00 == (SPIRType *)0x0) {
        type_00 = pSVar7;
      }
      vecsize = pSVar7->vecsize;
      if (row_major) {
        lVar9 = 0x1c;
        columns = vecsize;
        vecsize = pSVar7->columns;
      }
      else {
        lVar9 = 0x18;
        columns = pSVar7->columns;
      }
      physical_vecsize = *(uint32_t *)((type_00->array).stack_storage.aligned_char + lVar9 + -0x38);
      base_type = "float";
      if (pSVar7->width == 0x10) {
        base_type = "half";
      }
      ts_5 = (char **)0x20b39f;
      join<char_const*&,unsigned_int&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)&base_type,(char **)&columns,(uint *)0x2d1e49
                 ,(char (*) [2])&vecsize,(uint *)0x2d522e,in_stack_ffffffffffffff48);
      data_swiz = ".data";
      if (physical_vecsize < 5) {
        data_swiz = "";
      }
      load_swiz = "";
      if (physical_vecsize != vecsize) {
        load_swiz = unpack_expression_type::swizzle_lut[vecsize - 1];
      }
      local_a4 = 0;
      if (columns != 0) {
        do {
          if (local_a4 != 0) {
            ts_5 = (char **)0x20b414;
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          if ((char)uVar4 == '\0') {
            join<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const*&,char_const*&>
                      (&local_90,(spirv_cross *)expr_str,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2c1a1a
                       ,(char (*) [2])&local_a4,(uint *)0x2c191f,(char (*) [2])&data_swiz,&load_swiz
                       ,ts_5);
            ts_5 = (char **)0x20b4b4;
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_0020b4c3;
          }
          else {
            join<char_const*&,unsigned_int&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[2],char_const*&>
                      (&local_90,(spirv_cross *)&base_type,(char **)&physical_vecsize,
                       (uint *)0x2d522e,(char (*) [2])expr_str,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2c1a1a
                       ,(char (*) [2])&local_a4,(uint *)0x2c191f,(char (*) [2])0x2bd856,
                       (char (*) [2])&load_swiz,(char **)in_stack_ffffffffffffff48);
            ts_5 = (char **)0x20b466;
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
LAB_0020b4c3:
              ts_5 = (char **)0x20b4c8;
              operator_delete(local_90._M_dataplus._M_p);
            }
          }
          local_a4 = local_a4 + 1;
        } while (local_a4 < columns);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_90,this,pSVar7,0);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d522e,
               (char (*) [2])expr_str,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bd856,
               pacVar12);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return __return_storage_ptr__;
    }
  }
LAB_0020b341:
  operator_delete(local_90._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::unpack_expression_type(string expr_str, const SPIRType &type, uint32_t physical_type_id,
                                           bool packed, bool row_major)
{
	// Trivial case, nothing to do.
	if (physical_type_id == 0 && !packed)
		return expr_str;

	const SPIRType *physical_type = nullptr;
	if (physical_type_id)
		physical_type = &get<SPIRType>(physical_type_id);

	static const char *swizzle_lut[] = {
		".x",
		".xy",
		".xyz",
		"",
	};

	// TODO: Move everything to the template wrapper?
	bool uses_std140_wrapper = physical_type && physical_type->vecsize > 4;

	if (physical_type && is_vector(*physical_type) && is_array(*physical_type) &&
	    !uses_std140_wrapper &&
	    physical_type->vecsize > type.vecsize && !expression_ends_with(expr_str, swizzle_lut[type.vecsize - 1]))
	{
		// std140 array cases for vectors.
		assert(type.vecsize >= 1 && type.vecsize <= 3);
		return enclose_expression(expr_str) + swizzle_lut[type.vecsize - 1];
	}
	else if (physical_type && is_matrix(*physical_type) && is_vector(type) &&
	         !uses_std140_wrapper &&
	         physical_type->vecsize > type.vecsize)
	{
		// Extract column from padded matrix.
		assert(type.vecsize >= 1 && type.vecsize <= 4);
		return enclose_expression(expr_str) + swizzle_lut[type.vecsize - 1];
	}
	else if (is_matrix(type))
	{
		// Packed matrices are stored as arrays of packed vectors. Unfortunately,
		// we can't just pass the array straight to the matrix constructor. We have to
		// pass each vector individually, so that they can be unpacked to normal vectors.
		if (!physical_type)
			physical_type = &type;

		uint32_t vecsize = type.vecsize;
		uint32_t columns = type.columns;
		if (row_major)
			swap(vecsize, columns);

		uint32_t physical_vecsize = row_major ? physical_type->columns : physical_type->vecsize;

		const char *base_type = type.width == 16 ? "half" : "float";
		string unpack_expr = join(base_type, columns, "x", vecsize, "(");

		const char *load_swiz = "";
		const char *data_swiz = physical_vecsize > 4 ? ".data" : "";

		if (physical_vecsize != vecsize)
			load_swiz = swizzle_lut[vecsize - 1];

		for (uint32_t i = 0; i < columns; i++)
		{
			if (i > 0)
				unpack_expr += ", ";

			if (packed)
				unpack_expr += join(base_type, physical_vecsize, "(", expr_str, "[", i, "]", ")", load_swiz);
			else
				unpack_expr += join(expr_str, "[", i, "]", data_swiz, load_swiz);
		}

		unpack_expr += ")";
		return unpack_expr;
	}
	else
	{
		return join(type_to_glsl(type), "(", expr_str, ")");
	}
}